

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000084;
  long lVar5;
  size_t num_bytes_resulting;
  ulong local_38;
  
  *outl = 0;
  if (ctx->enc_data[0x2d] != '\0') {
    return -1;
  }
  if (CONCAT44(in_register_00000084,inl) == 0) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      bVar1 = in[lVar5];
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        if (ctx->enc_data[0x2c] != '\0') {
LAB_004bb021:
          ctx->enc_data[0x2d] = '\x01';
          return -1;
        }
        uVar2 = ctx->num;
        iVar3 = uVar2 + 1;
        ctx->num = iVar3;
        ctx->enc_data[(ulong)uVar2 - 4] = bVar1;
        if (iVar3 == 4) {
          iVar3 = base64_decode_quad(out,&local_38,(uint8_t *)&ctx->length);
          if (iVar3 == 0) goto LAB_004bb021;
          ctx->num = 0;
          if (local_38 < 3) {
            ctx->enc_data[0x2c] = '\x01';
          }
          uVar4 = uVar4 + local_38;
          out = out + local_38;
        }
      }
      lVar5 = lVar5 + 1;
    } while (CONCAT44(in_register_00000084,inl) != lVar5);
    if (uVar4 >> 0x1f != 0) {
      ctx->enc_data[0x2d] = '\x01';
      *outl = 0;
      return -1;
    }
  }
  *outl = (int)uVar4;
  return (uint)(ctx->enc_data[0x2c] == '\0');
}

Assistant:

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (ctx->error_encountered) {
    return -1;
  }

  size_t bytes_out = 0, i;
  for (i = 0; i < in_len; i++) {
    const char c = in[i];
    switch (c) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        continue;
    }

    if (ctx->eof_seen) {
      ctx->error_encountered = 1;
      return -1;
    }

    ctx->data[ctx->data_used++] = c;
    if (ctx->data_used == 4) {
      size_t num_bytes_resulting;
      if (!base64_decode_quad(out, &num_bytes_resulting, ctx->data)) {
        ctx->error_encountered = 1;
        return -1;
      }

      ctx->data_used = 0;
      bytes_out += num_bytes_resulting;
      out += num_bytes_resulting;

      if (num_bytes_resulting < 3) {
        ctx->eof_seen = 1;
      }
    }
  }

  if (bytes_out > INT_MAX) {
    ctx->error_encountered = 1;
    *out_len = 0;
    return -1;
  }
  *out_len = (int)bytes_out;

  if (ctx->eof_seen) {
    return 0;
  }

  return 1;
}